

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  int *piVar1;
  ImGuiTabBar *pIVar2;
  ImGuiWindow_conflict *window;
  int iVar3;
  ImGuiWindow_conflict **ppIVar4;
  long lVar5;
  long lVar6;
  byte local_34;
  
  if (((dst_node == src_node) || (dst_node == (ImGuiDockNode *)0x0)) ||
     (src_node == (ImGuiDockNode *)0x0)) {
    __assert_fail("src_node && dst_node && dst_node != src_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3556,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
  }
  pIVar2 = src_node->TabBar;
  iVar3 = (src_node->Windows).Size;
  if (pIVar2 != (ImGuiTabBar *)0x0) {
    if ((pIVar2->Tabs).Size < iVar3) {
      __assert_fail("src_node->Windows.Size <= src_node->TabBar->Tabs.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3559,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
    }
    if (dst_node->TabBar == (ImGuiTabBar *)0x0) {
      dst_node->TabBar = pIVar2;
      src_node->TabBar = (ImGuiTabBar *)0x0;
      local_34 = 1;
      goto LAB_001dec75;
    }
  }
  local_34 = 0;
LAB_001dec75:
  if (0 < iVar3) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      if (pIVar2 == (ImGuiTabBar *)0x0) {
        ppIVar4 = (src_node->Windows).Data + lVar6;
      }
      else {
        if ((pIVar2->Tabs).Size <= lVar6) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                        ,0x706,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
        }
        ppIVar4 = (ImGuiWindow_conflict **)((long)&((pIVar2->Tabs).Data)->ID + lVar5);
      }
      window = *ppIVar4;
      if (window != (ImGuiWindow_conflict *)0x0) {
        window->DockNode = (ImGuiDockNode *)0x0;
        window->field_0x3e1 = window->field_0x3e1 & 0xfe;
        DockNodeAddWindow(dst_node,window,(_Bool)(local_34 ^ 1));
        iVar3 = (src_node->Windows).Size;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar6 < iVar3);
  }
  ppIVar4 = (src_node->Windows).Data;
  if (ppIVar4 != (ImGuiWindow_conflict **)0x0) {
    (src_node->Windows).Size = 0;
    (src_node->Windows).Capacity = 0;
    if (GImGui != (ImGuiContext_conflict1 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    (src_node->Windows).Data = (ImGuiWindow_conflict **)0x0;
  }
  if ((local_34 == 0) && (pIVar2 = src_node->TabBar, pIVar2 != (ImGuiTabBar *)0x0)) {
    if (dst_node->TabBar != (ImGuiTabBar *)0x0) {
      dst_node->TabBar->SelectedTabId = pIVar2->SelectedTabId;
    }
    IM_DELETE<ImGuiTabBar>(pIVar2);
    src_node->TabBar = (ImGuiTabBar *)0x0;
  }
  return;
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size <= src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        // DockNode's TabBar may have non-window Tabs manually appended by user
        if (ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n])
        {
            window->DockNode = NULL;
            window->DockIsActive = false;
            DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
        }
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}